

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall cooper::timer::thread_func(timer *this)

{
  cv_status cVar1;
  long lVar2;
  long lVar3;
  unique_guard g;
  unique_lock<std::mutex> uStack_48;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_48,(mutex_type *)(this + 0x30));
  lVar2 = *(long *)(this + 0x90);
  if (*(long *)(this + 0x88) != lVar2 && *(long *)(this + 0x88) != 0) {
    cVar1 = std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
                      ((condition_variable *)(this + 0x58),&uStack_48,
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)(this + 0x88));
    if ((cVar1 == no_timeout) || (((byte)this[0x98] & 1) != 0)) goto LAB_00109b91;
    std::unique_lock<std::mutex>::unlock(&uStack_48);
    std::function<void_()>::operator()((function<void_()> *)(this + 8));
    std::unique_lock<std::mutex>::lock(&uStack_48);
    lVar2 = *(long *)(this + 0x90);
  }
  if (lVar2 != 0) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    local_38.__d.__r = (duration)(duration)(lVar2 + *(long *)(this + 0x90));
    while (((((byte)this[0x98] & 1) == 0 &&
            (cVar1 = std::condition_variable::
                     __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               ((condition_variable *)(this + 0x58),&uStack_48,&local_38),
            cVar1 != no_timeout)) && (((byte)this[0x98] & 1) == 0))) {
      std::unique_lock<std::mutex>::unlock(&uStack_48);
      std::function<void_()>::operator()((function<void_()> *)(this + 8));
      std::unique_lock<std::mutex>::lock(&uStack_48);
      lVar3 = *(long *)(this + 0x90) + (long)local_38.__d.__r;
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_38.__d.__r = (duration)(duration)lVar3;
      if (lVar3 <= lVar2) {
        local_38.__d.__r = (duration)(duration)lVar2;
      }
    }
  }
LAB_00109b91:
  std::unique_lock<std::mutex>::~unique_lock(&uStack_48);
  return;
}

Assistant:

void timer::thread_func()
{
	unique_guard g(lock_);
	if (initTime_.count() != 0 && initTime_.count() != interval_.count()) {
		if (cond_.wait_for(g, initTime_) == cv_status::no_timeout || quit_)
			return;
		g.unlock();
		func_();
		g.lock();
	}

	// If this was a one-shot, get out now.
	if (interval_.count() == 0)
		return;

	auto to = steady_clock::now() + interval_;

	while (!quit_) {
		if (cond_.wait_until(g, to) == cv_status::no_timeout || quit_)
			return;
		g.unlock();
		func_();
		g.lock();
		to = std::max(to+interval_, steady_clock::now());
	}
}